

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest3Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section10ValidPolicyMappingTest3Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.10.3";
  local_88.should_validate = false;
  PkitsTestInfo::SetInitialPolicySet(&local_88,"NIST-test-policy-1");
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<5ul,4ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a5040,(char *(*) [5])&PTR_anon_var_dwarf_28895f_005a5130,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest3Subpart1) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "P12Mapping1to3CACert",
      "P12Mapping1to3subCACert", "P12Mapping1to3subsubCACert",
      "ValidPolicyMappingTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "P12Mapping1to3CACRL",
                              "P12Mapping1to3subCACRL",
                              "P12Mapping1to3subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.3";
  info.should_validate = false;
  info.SetInitialPolicySet("NIST-test-policy-1");
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}